

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.hpp
# Opt level: O2

void __thiscall helics::EndpointInfo::~EndpointInfo(EndpointInfo *this)

{
  std::__cxx11::string::~string((string *)&this->destinationTargets);
  std::__cxx11::string::~string((string *)&this->sourceTargets);
  std::
  _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~_Vector_base(&(this->targets).
                   super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 );
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::~vector
            (&this->targetInformation);
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::~vector
            (&this->sourceInformation);
  std::
  deque<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::~deque(&(this->message_queue).m_obj);
  std::__cxx11::string::~string((string *)&this->type);
  std::__cxx11::string::~string((string *)&this->key);
  return;
}

Assistant:

EndpointInfo(GlobalHandle handle, std::string_view key_, std::string_view type_):
        id(handle), key(key_), type(type_)
    {
    }